

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall higan::Thread::~Thread(Thread *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  LogLevel LVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Logger local_328;
  Fmt local_110;
  
  if ((this->started == true) && (this->joined == false)) {
    LVar3 = Logger::GetLogLevel();
    if ((int)LVar3 < 2) {
      Logger::Logger(&local_328,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/Thread.cpp"
                     ,0x37,"~Thread");
      Fmt::Fmt(&local_110,"detach thread: %s",(this->name_)._M_dataplus._M_p);
      Logger::operator<<(&local_328,&local_110);
      Logger::~Logger(&local_328);
    }
    pthread_detach(this->thread_);
  }
  p_Var1 = (this->function_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->function_,(_Any_data *)&this->function_,__destroy_functor);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar4 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Thread::~Thread()
{
	/**
	 * 当线程未已经启动且未被Join detach线程继续运行 否则直接退出
	 */
	if (started && !joined)
	{
		LOG_INFO << higan::Fmt("detach thread: %s", name_.c_str());
		pthread_detach(thread_);
	}
}